

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void __thiscall
SFFile::AddPresetGenerators(SFFile *this,SFGenComposite *composite,int start,int stop,bool *gen_set)

{
  ushort uVar1;
  SFGenList *pSVar2;
  int iVar3;
  int iVar4;
  SFGenList *pSVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  anon_union_2_2_c2a07933_for_SFGenComposite_0 aVar9;
  
  iVar4 = stop - start;
  if (iVar4 != 0) {
    pSVar2 = this->PresetGenerators + stop;
    do {
      pSVar5 = pSVar2 + -1;
      uVar6 = (ulong)pSVar5->Oper;
      if (((uVar6 < 0x3b) && (gen_set[uVar6] == false)) &&
         (uVar7 = (ulong)GenDefs[uVar6].StructIndex, uVar7 < 0x33)) {
        if ((GenDefs[uVar6].Flags & 1) == 0) {
          iVar8 = (int)pSVar2[-1].field_1.Amount + (int)(short)(&composite->field_0)[uVar7];
          if (((GenDefs[uVar6].Flags & 0x10) == 0) ||
             (aVar9 = (anon_union_2_2_c2a07933_for_SFGenComposite_0)0x8000, -0x8000 < iVar8)) {
            iVar3 = (int)GenDefs[uVar6].Max;
            if (iVar8 < GenDefs[uVar6].Max) {
              iVar3 = iVar8;
            }
            aVar9 = SUB42(iVar3,0);
            if (iVar8 <= (short)*(anon_union_2_2_c2a07933_for_SFGenComposite_0 *)(GenDefs + uVar6))
            {
              aVar9 = *(anon_union_2_2_c2a07933_for_SFGenComposite_0 *)(GenDefs + uVar6);
            }
          }
          (&composite->field_0)[uVar7] = aVar9;
          uVar1 = pSVar5->Oper;
          gen_set[uVar1] = true;
          if ((ulong)uVar1 == 0x29) {
            return;
          }
        }
      }
      iVar4 = iVar4 + -1;
      pSVar2 = pSVar5;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void SFFile::AddPresetGenerators(SFGenComposite *composite, int start, int stop, bool gen_set[GEN_NumGenerators])
{
	// Proceed from last to first; later generators override earlier ones.
	SFGenList *gen = &PresetGenerators[stop - 1];
	const GenDef *def;

	for (int i = stop - start; i != 0; --i, --gen)
	{
		if (gen->Oper >= GEN_NumGenerators)
		{ // Unknown generator.
			continue;
		}
		if (gen_set[gen->Oper])
		{ // Generator was already set.
			continue;
		}
		def = &GenDefs[gen->Oper];
		if (def->StructIndex >= sizeof(SFGenComposite)/2)
		{ // Generator is either unused or ignored.
			continue;
		}
		if (def->Flags & GENF_InstrOnly)
		{ // Generator is not valid at the preset level.
			continue;
		}
		// Add to instrument/default generator.
		int added = ((SWORD *)composite)[def->StructIndex] + gen->Amount;
		// Clamp to proper range.
		if (added <= -32768 && def->Flags & GENF_32768_Ok)
		{
			added = -32768;
		}
		else
		{
			added = clamp<int>(added, def->Min, def->Max);
		}
		((SWORD *)composite)[def->StructIndex] = added;
		gen_set[gen->Oper] = true;
		if (gen->Oper == GEN_instrument)
		{ // Anything past the instrument generator is ignored.
			break;
		}
	}
}